

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void __thiscall
Js::CompoundString::Builder<256U>::AppendSlow
          (Builder<256U> *this,JavascriptString *s,void *packedSubstringInfo,
          void *packedSubstringInfo2,CharCount appendCharLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  CompoundString *toString;
  
  if (this->compoundString != (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x272,"(!this->compoundString)","!this->compoundString");
    if (!bVar2) goto LAB_00d53d6c;
    *puVar3 = 0;
  }
  toString = CompoundString::New(this->stringLength,this->directCharLength,this,this->charLength,
                                 true,(this->scriptContext->super_ScriptContextBase).
                                      javascriptLibrary);
  this->compoundString = toString;
  bVar2 = TryAppendGeneric<Js::CompoundString>
                    (s,packedSubstringInfo,packedSubstringInfo2,appendCharLength,toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x276,"(appended)","appended");
    if (!bVar2) {
LAB_00d53d6c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::Builder<MinimumCharCapacity>::AppendSlow(
        JavascriptString *const s,
        void *const packedSubstringInfo,
        void *const packedSubstringInfo2,
        const CharCount appendCharLength)
    {
        Assert(!this->compoundString);
        CompoundString *const compoundString = CreateCompoundString(true);
        this->compoundString = compoundString;
        const bool appended = TryAppendGeneric(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength, compoundString);
        Assert(appended);
    }